

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_core.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int epfd;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  epoll_data_t *peVar5;
  int unaff_R15D;
  epoll_event ev;
  _epollfd_connfd epollfd_connfd;
  socklen_t addrlen;
  pthread_t tid;
  sockaddr_in client_addr;
  pthread_attr_t pthread_attr_detach;
  epoll_event events [1024];
  epoll_event local_30b0;
  int local_30a4;
  int local_30a0;
  socklen_t local_309c;
  pthread_t local_3098;
  sockaddr local_3090;
  sockaddr local_3080;
  pthread_attr_t local_3070;
  epoll_event local_3038 [1024];
  
  if (argc == 2) {
    iVar1 = open(argv[1],0x80);
    close(iVar1);
    if (iVar1 == -1) {
      perror("going_is_file_existed.");
    }
    else {
      iVar1 = going_parse_config(argv[1]);
      if (iVar1 != -1) {
        iVar1 = going_socket(2,1,0);
        going_set_nonblocking(iVar1);
        going_set_reuse_addr(iVar1);
        local_3080.sa_data[6] = '\0';
        local_3080.sa_data[7] = '\0';
        local_3080.sa_data[8] = '\0';
        local_3080.sa_data[9] = '\0';
        local_3080.sa_data[10] = '\0';
        local_3080.sa_data[0xb] = '\0';
        local_3080.sa_data[0xc] = '\0';
        local_3080.sa_data[0xd] = '\0';
        local_3080.sa_family = 2;
        local_3080.sa_data[0] = 'P';
        local_3080.sa_data[1] = '\0';
        local_3080.sa_data[2] = '\0';
        local_3080.sa_data[3] = '\0';
        local_3080.sa_data[4] = '\0';
        local_3080.sa_data[5] = '\0';
        going_bind(iVar1,&local_3080,0x10);
        going_listen(iVar1,100);
        epfd = going_epoll_create(0x400);
        local_30b0.events = 1;
        local_30b0.data.fd = iVar1;
        going_epoll_add(epfd,iVar1,&local_30b0);
        pthread_attr_init(&local_3070);
        pthread_attr_setdetachstate(&local_3070,1);
        do {
          do {
            do {
              uVar2 = going_epoll_wait(epfd,local_3038,0x400,-1);
            } while (uVar2 == 0);
          } while ((uVar2 == 0xffffffff) && (piVar3 = __errno_location(), *piVar3 == 4));
          uVar4 = (ulong)uVar2;
          peVar5 = &local_3038[0].data;
          do {
            if (peVar5->fd == iVar1) {
              unaff_R15D = going_accept(iVar1,&local_3090,&local_309c);
              going_set_nonblocking(unaff_R15D);
              local_30b0.events = 0x80000001;
              local_30b0.data.fd = unaff_R15D;
              going_epoll_add(epfd,unaff_R15D,&local_30b0);
            }
            else {
              local_30b0.data.fd = unaff_R15D;
              local_30a4 = epfd;
              local_30a0 = peVar5->fd;
              going_epoll_del(epfd,unaff_R15D,&local_30b0);
              pthread_create(&local_3098,&local_3070,going_thread_func,&local_30a4);
            }
            peVar5 = (epoll_data_t *)(&peVar5->fd + 3);
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        } while( true );
      }
      puts("going_parse_config error!");
    }
  }
  else {
    printf("Usage: %s <config_path>\n",*argv);
  }
  exit(-1);
}

Assistant:

int main(int argc, char const *argv[])
{
	int    			   conn_sock;
	struct epoll_event ev;
	struct epoll_event events[MAXEVENTS];
	struct sockaddr_in server_addr;
	struct sockaddr_in client_addr;
	socklen_t          addrlen;
	pthread_attr_t     pthread_attr_detach;
	_epollfd_connfd    epollfd_connfd;
	pthread_t          tid;

	if(argc != 2){
		printf("Usage: %s <config_path>\n", argv[0]);
		exit(-1);
	}
	//Is configure existed?
	if(-1 == going_is_file_existed(argv[1])){
		perror("going_is_file_existed.");
		exit(-1);
	}
	//parse configure
	if(-1 == going_parse_config(argv[1])){
		printf("going_parse_config error!\n");
		exit(-1);
	}

	//创建监听套接字
	int listen_fd = going_socket(AF_INET, SOCK_STREAM, 0);
	//设置监听套接字为非阻塞模式
	going_set_nonblocking(listen_fd);
	//对套接字设置SO_REUSEADDR选项
	going_set_reuse_addr(listen_fd);


	//通过服务名和协议名获得相应的知名端口
	//struct servent* pservent = going_getservbyname("http", "tcp");
	//uint16_t listen_port = pservent->s_port;
	
	uint16_t listen_port = 80;

	bzero(&server_addr, sizeof(server_addr));
	server_addr.sin_family = AF_INET;
	server_addr.sin_port = (listen_port);
	server_addr.sin_addr.s_addr = htonl(INADDR_ANY);

	going_bind(listen_fd, (struct sockaddr*)&server_addr, sizeof(server_addr));
	going_listen(listen_fd, MAX_BACKLOG);

	// 创建epoll文件描述符
	int epollfd = going_epoll_create(MAXEVENTS);

	// 设置要处理的事件类型
	ev.events = EPOLLIN;
	// 设置与要处理的事件相关的文件描述符
	ev.data.fd = listen_fd;
	// 将监听事件加入epoll中
	going_epoll_add(epollfd, listen_fd, &ev);

	//设置线程属性为detach
	pthread_attr_init(&pthread_attr_detach);
	pthread_attr_setdetachstate(&pthread_attr_detach, PTHREAD_CREATE_DETACHED);

	for(;;){
		// 无限等待直到有描述符就绪
		int nfds = going_epoll_wait(epollfd, events, MAXEVENTS, -1);
		// 若going_epoll_wait被中断则重新调用该函数
		if(nfds == -1 && errno == EINTR)
			continue;

		for(int n = 0; n != nfds; ++n){
			// 处理监听套接字触发的事件
			if(events[n].data.fd == listen_fd){
				conn_sock = going_accept(listen_fd, (struct sockaddr *)&client_addr, &addrlen);
				// 设置新连接上的套接字为非阻塞模式
				going_set_nonblocking(conn_sock);
				// 设置读事件和ET模式
				ev.events = EPOLLIN | EPOLLET;
				ev.data.fd = conn_sock;
				// 将监听事件添加到epoll
				going_epoll_add(epollfd, conn_sock, &ev);
			}else{
				epollfd_connfd.epollfd = epollfd;
				epollfd_connfd.connfd = events[n].data.fd;
				ev.data.fd = conn_sock;
				// epoll不再监听这个事件
				going_epoll_del(epollfd, conn_sock, &ev);
				// 处理连接
				pthread_create(&tid, &pthread_attr_detach, &going_thread_func, (void *)&epollfd_connfd);
			}
		}
	}

	pthread_attr_destroy(&pthread_attr_detach);

	// 关闭监听描述符
	close(listen_fd);
	return 0;
}